

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

bool __thiscall cmGeneratorTarget::MacOSXUseInstallNameDir(cmGeneratorTarget *this)

{
  cmGlobalGenerator *this_00;
  bool bVar1;
  PolicyStatus PVar2;
  cmValue cVar3;
  string *target;
  char *extraout_RDX;
  string_view value;
  allocator<char> local_39;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"BUILD_WITH_INSTALL_NAME_DIR",&local_39);
  cVar3 = GetProperty(this,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  if (cVar3.Value == (string *)0x0) {
    PVar2 = GetPolicyStatusCMP0068(this);
    if (PVar2 == NEW) {
      bVar1 = false;
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_38,"BUILD_WITH_INSTALL_RPATH",&local_39);
      bVar1 = GetPropertyAsBool(this,&local_38);
      std::__cxx11::string::~string((string *)&local_38);
      if (bVar1 && PVar2 == WARN) {
        this_00 = this->LocalGenerator->GlobalGenerator;
        target = GetName_abi_cxx11_(this);
        cmGlobalGenerator::AddCMP0068WarnTarget(this_00,target);
        bVar1 = true;
      }
    }
  }
  else {
    value._M_str = extraout_RDX;
    value._M_len = (size_t)((cVar3.Value)->_M_dataplus)._M_p;
    bVar1 = cmValue::IsOn((cmValue *)(cVar3.Value)->_M_string_length,value);
  }
  return bVar1;
}

Assistant:

bool cmGeneratorTarget::MacOSXUseInstallNameDir() const
{
  cmValue build_with_install_name =
    this->GetProperty("BUILD_WITH_INSTALL_NAME_DIR");
  if (build_with_install_name) {
    return cmIsOn(*build_with_install_name);
  }

  cmPolicies::PolicyStatus cmp0068 = this->GetPolicyStatusCMP0068();
  if (cmp0068 == cmPolicies::NEW) {
    return false;
  }

  bool use_install_name = this->GetPropertyAsBool("BUILD_WITH_INSTALL_RPATH");

  if (use_install_name && cmp0068 == cmPolicies::WARN) {
    this->LocalGenerator->GetGlobalGenerator()->AddCMP0068WarnTarget(
      this->GetName());
  }

  return use_install_name;
}